

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Log(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  char *pcVar4;
  bool bVar5;
  FString text;
  FString formatted;
  FString local_30;
  FString local_28;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (puVar1 != (undefined8 *)0x0) {
          pPVar3 = (PClass *)puVar1[1];
          if (pPVar3 == (PClass *)0x0) {
            pPVar3 = (PClass *)(**(code **)*puVar1)(puVar1);
            puVar1[1] = pPVar3;
          }
          bVar5 = pPVar3 != (PClass *)0x0;
          if (pPVar3 != pPVar2 && bVar5) {
            do {
              pPVar3 = pPVar3->ParentClass;
              bVar5 = pPVar3 != (PClass *)0x0;
              if (pPVar3 == pPVar2) break;
            } while (pPVar3 != (PClass *)0x0);
          }
          if (!bVar5) {
            pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_003d45f2;
          }
        }
LAB_003d4554:
        if (numparam == 1) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\x02') {
            FString::AttachToOther(&local_30,(FString *)(param + 1));
            if (*local_30.Chars == '$') {
              pcVar4 = FStringTable::operator()(&GStrings,local_30.Chars + 1);
              FString::operator=(&local_30,pcVar4);
            }
            strbin1((char *)&local_28);
            Printf("%s\n",local_28.Chars);
            FString::~FString(&local_28);
            FString::~FString(&local_30);
            return 0;
          }
          pcVar4 = "param[paramnum].Type == REGT_STRING";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc84,
                      "int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      if (puVar1 == (undefined8 *)0x0) goto LAB_003d4554;
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d45f2:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc83,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Log)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING(text);

	if (text[0] == '$') text = GStrings(&text[1]);
	FString formatted = strbin1(text);
	Printf("%s\n", formatted.GetChars());
	return 0;
}